

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int print_mixw(char *fn)

{
  int iVar1;
  cmd_ln_t *pcVar2;
  long lVar3;
  ulong uVar4;
  uint mixw_s;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  double dVar9;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mixw;
  float32 ***mixw;
  uint local_5c;
  uint local_58;
  uint local_54;
  double local_50;
  float32 ***local_48;
  ulong local_40;
  long local_38;
  
  pcVar2 = cmd_ln_get();
  local_38 = cmd_ln_int_r(pcVar2,"-norm");
  pcVar7 = "and normalizing.";
  if ((int)local_38 == 0) {
    pcVar7 = ".";
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x1a5,"Reading %s%s\n",fn,pcVar7);
  pcVar2 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar2,"-mixws");
  uVar6 = 0xffffffff;
  uVar5 = 0xffffffff;
  if (pcVar7 != (char *)0x0) {
    pcVar2 = cmd_ln_get();
    uVar5 = cmd_ln_int_r(pcVar2,"-mixws");
  }
  pcVar2 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar2,"-mixwe");
  if (pcVar7 != (char *)0x0) {
    pcVar2 = cmd_ln_get();
    lVar3 = cmd_ln_int_r(pcVar2,"-mixwe");
    uVar6 = (uint)lVar3;
  }
  mixw_s = (uint)uVar5;
  if ((mixw_s & uVar6) == 0xffffffff) {
    iVar1 = s3mixw_read(fn,&local_48,&local_54,&local_58,&local_5c);
    if (iVar1 != 0) {
      return -1;
    }
    printf("mixw %u %u %u\n",(ulong)local_54,(ulong)local_58,(ulong)local_5c);
  }
  else {
    iVar1 = s3mixw_intv_read(fn,mixw_s,uVar6,&local_48,&local_54,&local_58,&local_5c);
    if (iVar1 != 0) {
      return -1;
    }
    printf("mixw %u %u %u subinterval [%u %u]\n",(ulong)local_54,(ulong)local_58,(ulong)local_5c,
           uVar5 & 0xffffffff,(ulong)uVar6);
  }
  if (local_54 != 0) {
    local_40 = uVar5 & 0xffffffff;
    if (mixw_s == 0xffffffff) {
      local_40 = 0;
    }
    uVar5 = 0;
    do {
      if (local_58 != 0) {
        uVar6 = (int)local_40 + (int)uVar5;
        uVar8 = 0;
        do {
          if ((ulong)local_5c == 0) {
            local_50 = 0.0;
          }
          else {
            local_50 = 0.0;
            uVar4 = 0;
            do {
              local_50 = local_50 + (double)(float)local_48[uVar5][uVar8][uVar4];
              uVar4 = uVar4 + 1;
            } while (local_5c != uVar4);
          }
          printf("mixw [%u %u] %e\n",(ulong)uVar6,uVar8 & 0xffffffff);
          dVar9 = 1.0;
          if ((((int)local_38 != 0) && (dVar9 = local_50, local_50 == 0.0)) && (!NAN(local_50))) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
                    ,0x1d5,"mixw [%u][%u][*] zero\n",(ulong)uVar6,uVar8 & 0xffffffff);
            dVar9 = 1.0;
          }
          local_50 = dVar9;
          if (local_5c != 0) {
            uVar4 = 0;
            do {
              if ((uVar4 & 7) == 0) {
                printf("\n\t");
              }
              printf(e_fmt,(double)(float)local_48[uVar5][uVar8][uVar4] / local_50);
              uVar4 = uVar4 + 1;
            } while (uVar4 < local_5c);
          }
          putchar(10);
          uVar8 = uVar8 + 1;
        } while (uVar8 < local_58);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_54);
  }
  return 0;
}

Assistant:

int
print_mixw(const char *fn)
{
    float32 ***mixw;
    uint32 n_mixw;
    uint32 mixw_s = NO_ID;
    uint32 mixw_e = NO_ID;
    uint32 n_feat;
    uint32 n_density;
    uint32 i, p_i, j, k;
    int32 normalize = cmd_ln_int32("-norm");
    float64 sum;

    E_INFO("Reading %s%s\n",
	   fn, (normalize ? "and normalizing." : "."));

    if (cmd_ln_str("-mixws")) {
	mixw_s = cmd_ln_int32("-mixws");
    }
    if (cmd_ln_str("-mixwe")) {
	mixw_e = cmd_ln_int32("-mixwe");
    }
    if (mixw_s == NO_ID && mixw_e == NO_ID) {
	if (s3mixw_read(fn,
			&mixw,
			&n_mixw,
			&n_feat,
			&n_density) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	printf("mixw %u %u %u\n", n_mixw, n_feat, n_density);
    }
    else {
	if (s3mixw_intv_read(fn,
			     mixw_s,
			     mixw_e,
			     &mixw,
			     &n_mixw,
			     &n_feat,
			     &n_density) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	printf("mixw %u %u %u subinterval [%u %u]\n",
	       n_mixw, n_feat, n_density, mixw_s, mixw_e);
    }


    for (i = 0; i < n_mixw; i++) {
	if (mixw_s != NO_ID)
	    p_i = i + mixw_s;
	else
	    p_i = i;

	for (j = 0; j < n_feat; j++) {
	    for (k = 0, sum = 0; k < n_density; k++) {
		sum += mixw[i][j][k];
	    }
		
	    printf("mixw [%u %u] %e\n", p_i, j, sum);

	    if (normalize) {
		if (sum == 0) {
		    E_WARN("mixw [%u][%u][*] zero\n", p_i, j);
		    sum = 1;
		}
	    }
	    else
		sum = 1;

	    for (k = 0; k < n_density; k++) {
		if ((k % 8) == 0)
		    printf("\n\t");
		printf(e_fmt, mixw[i][j][k]/sum);
	    }
	    printf("\n");
	}
    }
    return S3_SUCCESS;
}